

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

CURLcode file2memory(char *filename,dynbuf *filebuf)

{
  int iVar1;
  bool bVar2;
  char *local_50;
  char *line;
  dynbuf linebuf;
  FILE *file;
  CURLcode result;
  dynbuf *filebuf_local;
  char *filename_local;
  
  file._4_4_ = CURLE_OK;
  linebuf.toobig = (size_t)fopen64(filename,"r");
  Curl_dyn_init((dynbuf *)&line,0x1000);
  if (linebuf.toobig != 0) {
    do {
      iVar1 = Curl_get_line((dynbuf *)&line,(FILE *)linebuf.toobig);
      if (iVar1 == 0) break;
      local_50 = Curl_dyn_ptr((dynbuf *)&line);
      while( true ) {
        bVar2 = true;
        if (*local_50 != ' ') {
          bVar2 = *local_50 == '\t';
        }
        if (!bVar2) break;
        local_50 = local_50 + 1;
      }
    } while ((*local_50 == '#') ||
            (file._4_4_ = Curl_dyn_add(filebuf,local_50), file._4_4_ == CURLE_OK));
  }
  Curl_dyn_free((dynbuf *)&line);
  if (linebuf.toobig != 0) {
    fclose((FILE *)linebuf.toobig);
  }
  return file._4_4_;
}

Assistant:

static CURLcode file2memory(const char *filename, struct dynbuf *filebuf)
{
  CURLcode result = CURLE_OK;
  FILE *file = fopen(filename, FOPEN_READTEXT);
  struct dynbuf linebuf;
  Curl_dyn_init(&linebuf, MAX_NETRC_LINE);

  if(file) {
    while(Curl_get_line(&linebuf, file)) {
      const char *line = Curl_dyn_ptr(&linebuf);
      /* skip comments on load */
      while(ISBLANK(*line))
        line++;
      if(*line == '#')
        continue;
      result = Curl_dyn_add(filebuf, line);
      if(result)
        goto done;
    }
  }
done:
  Curl_dyn_free(&linebuf);
  if(file)
    fclose(file);
  return result;
}